

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,uint32_t *value)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  size_type sVar4;
  bool bVar5;
  bool bVar6;
  undefined1 uVar7;
  StreamReader *pSVar8;
  undefined8 *puVar9;
  long *plVar10;
  size_type *psVar11;
  ulong uVar12;
  char *pcVar13;
  _Alloc_hider _Var14;
  char *pcVar15;
  int iVar16;
  byte *pbVar17;
  uint uVar18;
  uint __len;
  uint uVar19;
  char sc;
  char c;
  string __str;
  stringstream ss;
  char local_219;
  string local_218;
  long *local_1f8;
  undefined8 local_1f0;
  long local_1e8;
  undefined8 uStack_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  long local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  bVar5 = Char1(this,&local_219);
  if (!bVar5) goto LAB_003a9f89;
  piVar1 = &(this->_curr_cursor).col;
  *piVar1 = *piVar1 + 1;
  if (local_219 == '+') {
    bVar5 = true;
LAB_003a9aae:
    local_218._M_dataplus._M_p._0_1_ = local_219;
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_218,1);
    pSVar8 = this->_sr;
    uVar12 = pSVar8->idx_;
    if (uVar12 < pSVar8->length_) {
      while (pSVar8->binary_[uVar12] != '\0') {
        bVar6 = Char1(this,(char *)&local_1f8);
        if (!bVar6) goto LAB_003a9f89;
        if (9 < (byte)((char)local_1f8 - 0x30U)) {
          pSVar8 = this->_sr;
          if ((0 < (long)pSVar8->idx_) && (uVar12 = pSVar8->idx_ - 1, uVar12 <= pSVar8->length_)) {
            pSVar8->idx_ = uVar12;
          }
          break;
        }
        local_218._M_dataplus._M_p._0_1_ = (char)local_1f8;
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_218,1);
        pSVar8 = this->_sr;
        uVar12 = pSVar8->idx_;
        if (pSVar8->length_ <= uVar12) break;
      }
    }
    if (bVar5) {
      ::std::__cxx11::stringbuf::str();
      sVar4 = local_218._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if (sVar4 == 1) {
        pcVar15 = "Integer value expected but got sign character only.\n";
        pcVar13 = "";
        goto LAB_003a9d0b;
      }
    }
    ::std::__cxx11::stringbuf::str();
    if (local_218._M_string_length < 2) {
      bVar5 = false;
    }
    else {
      ::std::__cxx11::stringbuf::str();
      bVar5 = (char)*local_1f8 == '0';
      if (local_1f8 != &local_1e8) {
        operator_delete(local_1f8,local_1e8 + 1);
      }
    }
    paVar2 = &local_218.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if (!bVar5) {
      ::std::__cxx11::stringbuf::str();
      _Var14._M_p = local_218._M_dataplus._M_p;
      ::std::__cxx11::stringbuf::str();
      plVar10 = local_1f8;
      ::std::__cxx11::stringbuf::str();
      pbVar17 = (byte *)((long)plVar10 + local_1d0);
      if ((byte *)_Var14._M_p != pbVar17) {
        iVar16 = -2;
        if (*_Var14._M_p == 0x2d) goto LAB_003a9eae;
        if (*_Var14._M_p == 0x2b) {
          _Var14._M_p = _Var14._M_p + 1;
        }
        if ((byte *)_Var14._M_p != pbVar17) {
          uVar19 = 0;
          do {
            bVar3 = *_Var14._M_p;
            if (((ulong)bVar3 < 0x21) && ((0x100003e01U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) break;
            if ((byte)(bVar3 - 0x3a) < 0xf6) goto LAB_003a9fbd;
            iVar16 = -3;
            if ((0x19999999 < uVar19) || (uVar19 == 0x19999999 && 5 < (byte)(bVar3 - 0x30)))
            goto LAB_003a9eae;
            uVar19 = (uint)(byte)(bVar3 - 0x30) + uVar19 * 10;
            _Var14._M_p = _Var14._M_p + 1;
          } while (_Var14._M_p < pbVar17);
          iVar16 = 0;
          goto LAB_003a9eae;
        }
      }
LAB_003a9fbd:
      iVar16 = -1;
LAB_003a9eae:
      if (local_1d8 != &local_1c8) {
        operator_delete(local_1d8,local_1c8._M_allocated_capacity + 1);
      }
      if (local_1f8 != &local_1e8) {
        operator_delete(local_1f8,local_1e8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      uVar7 = (*(code *)(&DAT_003eea90 + *(int *)(&DAT_003eea90 + (ulong)(iVar16 + 3) * 4)))();
      return (bool)uVar7;
    }
    local_218._M_dataplus._M_p = (pointer)paVar2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_218,"Zero padded integer value is not allowed.\n","");
    PushError(this,&local_218);
    local_1c8._M_allocated_capacity = local_218.field_2._M_allocated_capacity;
    _Var14._M_p = local_218._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p == paVar2) goto LAB_003a9f89;
  }
  else if (local_219 == '-') {
    local_218._M_dataplus._M_p._0_1_ = 0x2d;
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_218,1);
    pcVar15 = "Unsigned value expected but got \'-\' sign.";
    pcVar13 = "";
LAB_003a9d0b:
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,pcVar15,pcVar13);
    PushError(this,&local_218);
    local_1c8._M_allocated_capacity = local_218.field_2._M_allocated_capacity;
    _Var14._M_p = local_218._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p == &local_218.field_2) goto LAB_003a9f89;
  }
  else {
    if ((byte)(local_219 - 0x30U) < 10) {
      bVar5 = false;
      goto LAB_003a9aae;
    }
    uVar18 = (uint)local_219;
    uVar19 = -uVar18;
    if (0 < (int)uVar18) {
      uVar19 = uVar18;
    }
    __len = 1;
    if (9 < uVar19) {
      __len = 3 - (uVar19 < 100);
    }
    local_1d8 = &local_1c8;
    ::std::__cxx11::string::_M_construct((ulong)&local_1d8,(char)__len - (local_219 >> 7));
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              (local_1d8->_M_local_buf + (uVar18 >> 0x1f),__len,uVar19);
    puVar9 = (undefined8 *)::std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,0x3eed48)
    ;
    plVar10 = puVar9 + 2;
    if ((long *)*puVar9 == plVar10) {
      local_1e8 = *plVar10;
      uStack_1e0 = puVar9[3];
      local_1f8 = &local_1e8;
    }
    else {
      local_1e8 = *plVar10;
      local_1f8 = (long *)*puVar9;
    }
    local_1f0 = puVar9[1];
    *puVar9 = plVar10;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)::std::__cxx11::string::append((char *)&local_1f8);
    psVar11 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_218.field_2._M_allocated_capacity = *psVar11;
      local_218.field_2._8_8_ = puVar9[3];
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    }
    else {
      local_218.field_2._M_allocated_capacity = *psVar11;
      local_218._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_218._M_string_length = puVar9[1];
    *puVar9 = psVar11;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    PushError(this,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8,local_1e8 + 1);
    }
    _Var14._M_p = (pointer)local_1d8;
    if (local_1d8 == &local_1c8) goto LAB_003a9f89;
  }
  operator_delete(_Var14._M_p,local_1c8._M_allocated_capacity + 1);
LAB_003a9f89:
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool AsciiParser::ReadBasicType(uint32_t *value) {
  std::stringstream ss;

  // head character
  bool has_sign = false;
  bool negative = false;
  {
    char sc;
    if (!Char1(&sc)) {
      return false;
    }
    _curr_cursor.col++;

    // sign or [0-9]
    if (sc == '+') {
      negative = false;
      has_sign = true;
    } else if (sc == '-') {
      negative = true;
      has_sign = true;
    } else if ((sc >= '0') && (sc <= '9')) {
      // ok
    } else {
      PushError("Sign or 0-9 expected, but got '" + std::to_string(sc) +
                "'.\n");
      return false;
    }

    ss << sc;
  }

  if (negative) {
    PushError("Unsigned value expected but got '-' sign.");
    return false;
  }

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if ((c >= '0') && (c <= '9')) {
      ss << c;
    } else {
      _sr->seek_from_current(-1);
      break;
    }
  }

  if (has_sign && (ss.str().size() == 1)) {
    // sign only
    PushError("Integer value expected but got sign character only.\n");
    return false;
  }

  if ((ss.str().size() > 1) && (ss.str()[0] == '0')) {
    PushError("Zero padded integer value is not allowed.\n");
    return false;
  }

  // std::cout << "ReadInt token: " << ss.str() << "\n";

#if defined(__cpp_exceptions) || defined(__EXCEPTIONS)
  try {
    (*value) = uint32_t(std::stoull(ss.str()));
  } catch (const std::invalid_argument &e) {
    (void)e;
    PushError("Not an 64bit unsigned integer literal.\n");
    return false;
  } catch (const std::out_of_range &e) {
    (void)e;
    PushError("64bit unsigned integer value out of range.\n");
    return false;
  }
  return true;
#else
  // use jsteemann/atoi
  int retcode = 0;
  auto result = jsteemann::atoi<uint32_t>(
      ss.str().c_str(), ss.str().c_str() + ss.str().size(), retcode);
  DCOUT("sz = " << ss.str().size());
  DCOUT("ss = " << ss.str() << ", retcode = " << retcode
                << ", result = " << result);
  if (retcode == jsteemann::SUCCESS) {
    (*value) = result;
    return true;
  } else if (retcode == jsteemann::INVALID_INPUT) {
    PushError("Not an 32bit unsigned integer literal.\n");
    return false;
  } else if (retcode == jsteemann::INVALID_NEGATIVE_SIGN) {
    PushError("Negative sign `-` specified for uint32 integer.\n");
    return false;
  } else if (retcode == jsteemann::VALUE_OVERFLOW) {
    PushError("Integer value overflows.\n");
    return false;
  }

  PushError("Invalid integer literal\n");
  return false;
#endif
}